

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

type __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::operator()
          (arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>
           *this,bool value)

{
  basic_format_specs<char> *spec;
  ulong uVar1;
  char *data;
  char *pcVar2;
  ulong size;
  ulong uVar3;
  str_writer<char> f;
  
  spec = *(basic_format_specs<char> **)(this + 0x10);
  if (spec->type_ == '\0') {
    pcVar2 = "false";
    if (value) {
      pcVar2 = "true";
    }
    uVar1 = (ulong)value ^ 5;
    uVar3 = (ulong)spec->precision_;
    size = uVar1;
    if (uVar3 < uVar1) {
      size = uVar3;
    }
    if ((long)uVar3 < 0) {
      size = uVar1;
    }
    f.size = size;
    f.s = pcVar2;
    basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
    write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::str_writer<char>>
              ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *)
               this,size,&spec->super_align_spec,f);
  }
  else {
    basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
    write_int<int,fmt::v5::basic_format_specs<char>>
              ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *)
               this,(uint)value,spec);
  }
  return (type)*(basic_buffer<char> **)this;
}

Assistant:

typename std::enable_if<std::is_integral<T>::value, iterator>::type
      operator()(T value) {
    // MSVC2013 fails to compile separate overloads for bool and char_type so
    // use std::is_same instead.
    if (std::is_same<T, bool>::value) {
      if (specs_.type_)
        return (*this)(value ? 1 : 0);
      write(value != 0);
    } else if (std::is_same<T, char_type>::value) {
      internal::handle_char_specs(
        specs_, char_spec_handler(*this, static_cast<char_type>(value)));
    } else {
      writer_.write_int(value, specs_);
    }
    return out();
  }